

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdDecomposeTripleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  word wVar2;
  char acVar3 [8];
  ulong uVar4;
  int i;
  int iVar5;
  uint uVar6;
  undefined8 *puVar7;
  size_t sVar8;
  byte bVar9;
  byte bVar10;
  char (*pacVar11) [32];
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  word *pwVar17;
  ulong *puVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  word *pwVar23;
  char *pcVar24;
  ulong *puVar25;
  char (*pacVar26) [8];
  ulong uVar27;
  word *pwVar28;
  word *pwVar29;
  Dau_Dsd_t *pDVar30;
  char *pcVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  word pTtCof [2] [64];
  timespec ts;
  int local_1184;
  long local_1170;
  char local_1132 [10];
  ulong local_1128 [64];
  ulong local_f28 [64];
  Dau_Dsd_t local_d28;
  
  iVar5 = clock_gettime(3,(timespec *)&local_d28);
  if (iVar5 < 0) {
    local_1170 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_d28.nSizeNonDec,local_d28.nPos)),8);
    local_1170 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_d28._0_8_ * -1000000;
  }
  uVar12 = (ulong)(uint)nVars;
  do {
    uVar19 = uVar12;
    if (0 < (int)uVar12) {
      do {
        uVar32 = uVar12 - 1;
        uVar6 = (uint)uVar19;
        if ((int)uVar6 < 1) {
          uVar16 = 0;
        }
        else {
          bVar10 = 0;
          uVar33 = 0;
          uVar16 = 0;
          do {
            if (uVar32 != uVar33) {
              iVar5 = Dau_DsdFindSupportOne(p,pTruth,pVars,uVar6,(int)uVar32,(int)uVar33);
              uVar16 = uVar16 | iVar5 << (bVar10 & 0x1f);
            }
            uVar33 = uVar33 + 1;
            bVar10 = bVar10 + 2;
          } while (uVar6 != (uint)uVar33);
        }
        if ((uVar16 & uVar16 >> 1 & 0x55555555) == 0) {
          uVar16 = 1 << ((char)uVar19 - 6U & 0x1f);
          if ((int)uVar6 < 7) {
            uVar16 = 1;
          }
          local_d28.fSplitPrime = 0;
          local_d28.fWriteTruth = p->fWriteTruth;
          iVar5 = pVars[uVar32];
          lVar15 = (long)(int)uVar6;
          lVar14 = lVar15 + -1;
          pVars[uVar32] = pVars[lVar15 + -1];
          pVars[lVar15 + -1] = iVar5;
          Abc_TtSwapVars(pTruth,uVar6,(int)uVar32,uVar6 - 1);
          bVar10 = (byte)lVar14;
          if (uVar16 == 1) {
            local_1128[0] =
                 (s_Truths6Neg[lVar14] & *pTruth) << ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                 s_Truths6Neg[lVar14] & *pTruth;
          }
          else if ((int)uVar6 < 7) {
            if (0 < (int)uVar16) {
              uVar33 = s_Truths6Neg[lVar14];
              uVar27 = 0;
              do {
                local_1128[uVar27] =
                     (pTruth[uVar27] & uVar33) << ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                     pTruth[uVar27] & uVar33;
                uVar27 = uVar27 + 1;
              } while (uVar16 != uVar27);
            }
          }
          else if (0 < (int)uVar16) {
            bVar9 = (byte)(uVar6 - 7);
            uVar13 = 1 << (bVar9 & 0x1f);
            iVar5 = 2 << (bVar9 & 0x1f);
            uVar33 = 1;
            if (1 < (int)uVar13) {
              uVar33 = (ulong)uVar13;
            }
            puVar18 = local_1128 + (int)uVar13;
            puVar25 = local_1128;
            pwVar23 = pTruth;
            do {
              if (uVar6 - 7 != 0x1f) {
                uVar27 = 0;
                do {
                  uVar4 = pwVar23[uVar27];
                  puVar25[uVar27] = uVar4;
                  puVar18[uVar27] = uVar4;
                  uVar27 = uVar27 + 1;
                } while (uVar33 != uVar27);
              }
              pwVar23 = pwVar23 + iVar5;
              puVar18 = puVar18 + iVar5;
              puVar25 = puVar25 + iVar5;
            } while (pwVar23 < pTruth + (int)uVar16);
          }
          if (uVar16 == 1) {
            local_f28[0] = (s_Truths6[lVar14] & *pTruth) >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                           s_Truths6[lVar14] & *pTruth;
          }
          else if ((int)uVar6 < 7) {
            if (0 < (int)uVar16) {
              uVar33 = s_Truths6[lVar14];
              uVar27 = 0;
              do {
                local_f28[uVar27] =
                     (pTruth[uVar27] & uVar33) >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                     pTruth[uVar27] & uVar33;
                uVar27 = uVar27 + 1;
              } while (uVar16 != uVar27);
            }
          }
          else if (0 < (int)uVar16) {
            bVar10 = (byte)(uVar6 - 7);
            uVar13 = 1 << (bVar10 & 0x1f);
            iVar5 = 2 << (bVar10 & 0x1f);
            uVar33 = 1;
            if (1 < (int)uVar13) {
              uVar33 = (ulong)uVar13;
            }
            pwVar23 = pTruth;
            pwVar17 = local_f28;
            do {
              uVar27 = uVar33;
              pwVar28 = pwVar23;
              pwVar29 = pwVar17;
              if (uVar6 - 7 != 0x1f) {
                do {
                  wVar2 = pwVar28[(int)uVar13];
                  *pwVar29 = wVar2;
                  pwVar29[(int)uVar13] = wVar2;
                  uVar27 = uVar27 - 1;
                  pwVar28 = pwVar28 + 1;
                  pwVar29 = pwVar29 + 1;
                } while (uVar27 != 0);
              }
              pwVar23 = pwVar23 + iVar5;
              pwVar17 = pwVar17 + iVar5;
            } while (pwVar23 < pTruth + (int)uVar16);
          }
          iVar5 = p->nPos;
          p->nPos = iVar5 + 1;
          p->pOutput[iVar5] = '<';
          Dau_DsdWriteVar(p,pVars[lVar14],0);
          Dau_DsdDecomposeInt(&local_d28,local_f28,(int)lVar14);
          if (local_d28.pOutput[0] != 0) {
            pcVar24 = local_d28.pOutput;
            bVar10 = local_d28.pOutput[0];
            do {
              pcVar24 = pcVar24 + 1;
              if (((char)bVar10 < 'a') || ((int)(uVar6 + 0x60) <= (int)(uint)bVar10)) {
                iVar5 = p->nPos;
                p->nPos = iVar5 + 1;
                p->pOutput[iVar5] = bVar10;
              }
              else {
                Dau_DsdWriteVar(p,pVars[(ulong)bVar10 - 0x61],0);
              }
              bVar10 = *pcVar24;
            } while (bVar10 != 0);
          }
          p->nSizeNonDec = local_d28.nSizeNonDec;
          if (local_d28.nSizeNonDec != 0) {
            uVar16 = 1 << ((char)local_d28.nSizeNonDec - 6U & 0x1f);
            if (local_d28.nSizeNonDec < 7) {
              uVar16 = 1;
            }
            if (0 < (int)uVar16) {
              memcpy(pTruth,local_f28,(ulong)uVar16 << 3);
            }
          }
          Dau_DsdDecomposeInt(&local_d28,local_1128,(int)lVar14);
          if (local_d28.pOutput[0] != 0) {
            pcVar24 = local_d28.pOutput;
            bVar10 = local_d28.pOutput[0];
            do {
              pcVar24 = pcVar24 + 1;
              if (((char)bVar10 < 'a') || ((int)(uVar6 + 0x60) <= (int)(uint)bVar10)) {
                iVar5 = p->nPos;
                p->nPos = iVar5 + 1;
                p->pOutput[iVar5] = bVar10;
              }
              else {
                Dau_DsdWriteVar(p,pVars[(ulong)bVar10 - 0x61],0);
              }
              bVar10 = *pcVar24;
            } while (bVar10 != 0);
          }
          iVar5 = p->nPos;
          p->nPos = iVar5 + 1;
          p->pOutput[iVar5] = '>';
          iVar5 = p->nSizeNonDec;
          if (p->nSizeNonDec <= local_d28.nSizeNonDec) {
            iVar5 = local_d28.nSizeNonDec;
          }
          p->nSizeNonDec = iVar5;
          if (local_d28.nSizeNonDec != 0) {
            uVar6 = 1 << ((char)local_d28.nSizeNonDec - 6U & 0x1f);
            if (local_d28.nSizeNonDec < 7) {
              uVar6 = 1;
            }
            if (0 < (int)uVar6) {
              memcpy(pTruth,local_1128,(ulong)uVar6 << 3);
            }
          }
          bVar36 = false;
          iVar5 = 1;
          local_1184 = 0;
        }
        else {
          uVar21 = ~uVar16 >> 1 & uVar16;
          uVar22 = uVar21 & 0x55555555;
          uVar13 = uVar22 - 1;
          iVar5 = 0;
          bVar36 = true;
          if ((uVar13 < (uVar22 ^ uVar13)) &&
             (uVar13 = ~uVar16 & uVar16 >> 1, uVar22 = uVar13 & 0x55555555, uVar16 = uVar22 - 1,
             iVar5 = 0, bVar36 = true, uVar16 < (uVar22 ^ uVar16))) {
            uVar16 = 1 << ((char)uVar19 - 6U & 0x1f);
            if ((int)uVar6 < 7) {
              uVar16 = 1;
            }
            uVar21 = uVar21 & 0x55555555;
            if (uVar21 == 0) {
LAB_0049cefd:
              __assert_fail("Supp > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                            ,0x3eb,"int Abc_TtSuppFindFirst(int)");
            }
            uVar22 = 0;
            do {
              if ((uVar21 >> (uVar22 & 0x1f) & 1) != 0) goto LAB_0049bf3f;
              uVar22 = uVar22 + 1;
            } while (uVar22 != 0x20);
            uVar22 = 0xffffffff;
LAB_0049bf3f:
            uVar13 = uVar13 & 0x55555555;
            if (uVar13 == 0) goto LAB_0049cefd;
            iVar5 = (int)uVar22 >> 1;
            uVar21 = 0;
            do {
              if ((uVar13 >> (uVar21 & 0x1f) & 1) != 0) goto LAB_0049bf60;
              uVar21 = uVar21 + 1;
            } while (uVar21 != 0x20);
            uVar21 = 0xffffffff;
LAB_0049bf60:
            bVar10 = (byte)uVar32;
            if (uVar16 == 1) {
              local_1128[0] =
                   (s_Truths6Neg[uVar32] & *pTruth) << ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                   s_Truths6Neg[uVar32] & *pTruth;
            }
            else if ((long)uVar12 < 7) {
              if (0 < (int)uVar16) {
                uVar33 = s_Truths6Neg[uVar32];
                uVar27 = 0;
                do {
                  local_1128[uVar27] =
                       (pTruth[uVar27] & uVar33) << ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                       pTruth[uVar27] & uVar33;
                  uVar27 = uVar27 + 1;
                } while (uVar16 != uVar27);
              }
            }
            else if (0 < (int)uVar16) {
              bVar9 = (byte)(uVar12 - 7);
              uVar13 = 1 << (bVar9 & 0x1f);
              iVar20 = 2 << (bVar9 & 0x1f);
              uVar33 = 1;
              if (1 < (int)uVar13) {
                uVar33 = (ulong)uVar13;
              }
              puVar18 = local_1128 + (int)uVar13;
              puVar25 = local_1128;
              pwVar23 = pTruth;
              do {
                if (uVar12 - 7 != 0x1f) {
                  uVar27 = 0;
                  do {
                    uVar4 = pwVar23[uVar27];
                    puVar25[uVar27] = uVar4;
                    puVar18[uVar27] = uVar4;
                    uVar27 = uVar27 + 1;
                  } while (uVar33 != uVar27);
                }
                pwVar23 = pwVar23 + iVar20;
                puVar18 = puVar18 + iVar20;
                puVar25 = puVar25 + iVar20;
              } while (pwVar23 < pTruth + (int)uVar16);
            }
            if (uVar16 == 1) {
              local_f28[0] = (s_Truths6[uVar32] & *pTruth) >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f)
                             | s_Truths6[uVar32] & *pTruth;
            }
            else if ((long)uVar12 < 7) {
              if (0 < (int)uVar16) {
                uVar33 = s_Truths6[uVar32];
                uVar27 = 0;
                do {
                  local_f28[uVar27] =
                       (pTruth[uVar27] & uVar33) >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                       pTruth[uVar27] & uVar33;
                  uVar27 = uVar27 + 1;
                } while (uVar16 != uVar27);
              }
            }
            else if (0 < (int)uVar16) {
              bVar10 = (byte)(uVar12 - 7);
              uVar13 = 1 << (bVar10 & 0x1f);
              iVar20 = 2 << (bVar10 & 0x1f);
              uVar33 = 1;
              if (1 < (int)uVar13) {
                uVar33 = (ulong)uVar13;
              }
              pwVar23 = pTruth;
              puVar25 = local_f28;
              do {
                pwVar17 = pwVar23;
                uVar27 = uVar33;
                puVar18 = puVar25;
                if (uVar12 - 7 != 0x1f) {
                  do {
                    uVar4 = pwVar17[(int)uVar13];
                    *puVar18 = uVar4;
                    puVar18[(int)uVar13] = uVar4;
                    uVar27 = uVar27 - 1;
                    pwVar17 = pwVar17 + 1;
                    puVar18 = puVar18 + 1;
                  } while (uVar27 != 0);
                }
                pwVar23 = pwVar23 + iVar20;
                puVar25 = puVar25 + iVar20;
              } while (pwVar23 < pTruth + (int)uVar16);
            }
            bVar10 = (byte)iVar5;
            if (uVar16 == 1) {
              uVar33 = (s_Truths6Neg[iVar5] & local_1128[0]) <<
                       ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) | s_Truths6Neg[iVar5] & local_1128[0];
              local_d28.nVarsInit = (int)uVar33;
              local_d28.nVarsUsed = (int)(uVar33 >> 0x20);
            }
            else if (iVar5 < 6) {
              if (0 < (int)uVar16) {
                uVar33 = s_Truths6Neg[iVar5];
                uVar27 = 0;
                do {
                  local_d28.pVarDefs[uVar27 - 5] =
                       (char  [8])
                       ((local_1128[uVar27] & uVar33) << ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                       local_1128[uVar27] & uVar33);
                  uVar27 = uVar27 + 1;
                } while (uVar16 != uVar27);
              }
            }
            else if (0 < (int)uVar16) {
              bVar9 = (byte)(iVar5 + -6);
              uVar13 = 1 << (bVar9 & 0x1f);
              lVar14 = (long)(2 << (bVar9 & 0x1f));
              uVar33 = 1;
              if (1 < (int)uVar13) {
                uVar33 = (ulong)uVar13;
              }
              pacVar26 = local_d28.pVarDefs + (long)(int)uVar13 + -5;
              puVar25 = local_1128;
              pDVar30 = &local_d28;
              do {
                if (iVar5 + -6 != 0x1f) {
                  uVar27 = 0;
                  do {
                    acVar3 = *(char (*) [8])(puVar25 + uVar27);
                    pDVar30->pVarDefs[uVar27 - 5] = acVar3;
                    pacVar26[uVar27] = acVar3;
                    uVar27 = uVar27 + 1;
                  } while (uVar33 != uVar27);
                }
                puVar25 = puVar25 + lVar14;
                pacVar26 = pacVar26 + lVar14;
                pDVar30 = (Dau_Dsd_t *)(pDVar30->pVarDefs + lVar14 + -5);
              } while (puVar25 < local_1128 + (int)uVar16);
            }
            if (uVar16 == 1) {
              uVar33 = (s_Truths6[iVar5] & local_1128[0]) >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                       s_Truths6[iVar5] & local_1128[0];
              local_d28.Cache[6][0x18] = (char)uVar33;
              local_d28.Cache[6][0x19] = (char)(uVar33 >> 8);
              local_d28.Cache[6][0x1a] = (char)(uVar33 >> 0x10);
              local_d28.Cache[6][0x1b] = (char)(uVar33 >> 0x18);
              local_d28.Cache[6][0x1c] = (char)(uVar33 >> 0x20);
              local_d28.Cache[6][0x1d] = (char)(uVar33 >> 0x28);
              local_d28.Cache[6][0x1e] = (char)(uVar33 >> 0x30);
              local_d28.Cache[6][0x1f] = (char)(uVar33 >> 0x38);
            }
            else if (iVar5 < 6) {
              if (0 < (int)uVar16) {
                uVar33 = s_Truths6[iVar5];
                uVar27 = 0;
                do {
                  *(ulong *)(local_d28.Cache[6] + uVar27 * 8 + 0x18) =
                       (local_1128[uVar27] & uVar33) >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                       local_1128[uVar27] & uVar33;
                  uVar27 = uVar27 + 1;
                } while (uVar16 != uVar27);
              }
            }
            else if (0 < (int)uVar16) {
              bVar10 = (byte)(iVar5 + -6);
              uVar13 = 1 << (bVar10 & 0x1f);
              uVar33 = 1;
              if (1 < (int)uVar13) {
                uVar33 = (ulong)uVar13;
              }
              lVar14 = (long)(2 << (bVar10 & 0x1f));
              puVar25 = local_1128;
              pcVar24 = local_d28.Cache[6] + 0x18;
              do {
                puVar18 = puVar25;
                uVar27 = uVar33;
                pcVar31 = pcVar24;
                if (iVar5 + -6 != 0x1f) {
                  do {
                    uVar4 = puVar18[(int)uVar13];
                    *(ulong *)pcVar31 = uVar4;
                    *(ulong *)(pcVar31 + (long)(int)uVar13 * 8) = uVar4;
                    uVar27 = uVar27 - 1;
                    puVar18 = puVar18 + 1;
                    pcVar31 = pcVar31 + 8;
                  } while (uVar27 != 0);
                }
                puVar25 = puVar25 + lVar14;
                pcVar24 = pcVar24 + lVar14 * 8;
              } while (puVar25 < local_1128 + (int)uVar16);
            }
            iVar20 = (int)uVar21 >> 1;
            bVar10 = (byte)iVar20;
            if (uVar16 == 1) {
              uVar33 = (s_Truths6Neg[iVar20] & local_f28[0]) <<
                       ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) | s_Truths6Neg[iVar20] & local_f28[0];
              local_d28.Cache[0x16][0x18] = (char)uVar33;
              local_d28.Cache[0x16][0x19] = (char)(uVar33 >> 8);
              local_d28.Cache[0x16][0x1a] = (char)(uVar33 >> 0x10);
              local_d28.Cache[0x16][0x1b] = (char)(uVar33 >> 0x18);
              local_d28.Cache[0x16][0x1c] = (char)(uVar33 >> 0x20);
              local_d28.Cache[0x16][0x1d] = (char)(uVar33 >> 0x28);
              local_d28.Cache[0x16][0x1e] = (char)(uVar33 >> 0x30);
              local_d28.Cache[0x16][0x1f] = (char)(uVar33 >> 0x38);
            }
            else if (iVar20 < 6) {
              if (0 < (int)uVar16) {
                uVar33 = s_Truths6Neg[iVar20];
                uVar27 = 0;
                do {
                  *(ulong *)(local_d28.Cache[0x16] + uVar27 * 8 + 0x18) =
                       (local_f28[uVar27] & uVar33) << ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                       local_f28[uVar27] & uVar33;
                  uVar27 = uVar27 + 1;
                } while (uVar16 != uVar27);
              }
            }
            else if (0 < (int)uVar16) {
              bVar9 = (byte)(iVar20 + -6);
              uVar13 = 1 << (bVar9 & 0x1f);
              lVar14 = (long)(2 << (bVar9 & 0x1f));
              uVar33 = 1;
              if (1 < (int)uVar13) {
                uVar33 = (ulong)uVar13;
              }
              pcVar31 = local_d28.Cache[0x16] + 0x18;
              pcVar24 = pcVar31 + (long)(int)uVar13 * 8;
              puVar25 = local_f28;
              do {
                if (iVar20 + -6 != 0x1f) {
                  uVar27 = 0;
                  do {
                    uVar4 = puVar25[uVar27];
                    *(ulong *)(pcVar31 + uVar27 * 8) = uVar4;
                    *(ulong *)(pcVar24 + uVar27 * 8) = uVar4;
                    uVar27 = uVar27 + 1;
                  } while (uVar33 != uVar27);
                }
                puVar25 = puVar25 + lVar14;
                pcVar24 = pcVar24 + lVar14 * 8;
                pcVar31 = pcVar31 + lVar14 * 8;
              } while (puVar25 < local_f28 + (int)uVar16);
            }
            if (uVar16 == 1) {
              uVar33 = (s_Truths6[iVar20] & local_f28[0]) >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                       s_Truths6[iVar20] & local_f28[0];
              local_d28.pOutput[0xd8] = (char)uVar33;
              local_d28.pOutput[0xd9] = (char)(uVar33 >> 8);
              local_d28.pOutput[0xda] = (char)(uVar33 >> 0x10);
              local_d28.pOutput[0xdb] = (char)(uVar33 >> 0x18);
              local_d28.pOutput[0xdc] = (char)(uVar33 >> 0x20);
              local_d28.pOutput[0xdd] = (char)(uVar33 >> 0x28);
              local_d28.pOutput[0xde] = (char)(uVar33 >> 0x30);
              local_d28.pOutput[0xdf] = (char)(uVar33 >> 0x38);
            }
            else if (iVar20 < 6) {
              if (0 < (int)uVar16) {
                uVar33 = s_Truths6[iVar20];
                uVar27 = 0;
                do {
                  *(ulong *)(local_d28.pOutput + uVar27 * 8 + 0xd8) =
                       (local_f28[uVar27] & uVar33) >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) |
                       local_f28[uVar27] & uVar33;
                  uVar27 = uVar27 + 1;
                } while (uVar16 != uVar27);
              }
            }
            else if (0 < (int)uVar16) {
              bVar10 = (byte)(iVar20 + -6);
              uVar13 = 1 << (bVar10 & 0x1f);
              uVar33 = 1;
              if (1 < (int)uVar13) {
                uVar33 = (ulong)uVar13;
              }
              lVar14 = (long)(2 << (bVar10 & 0x1f));
              pcVar24 = local_d28.pOutput + 0xd8;
              puVar25 = local_f28;
              do {
                puVar18 = puVar25;
                uVar27 = uVar33;
                pcVar31 = pcVar24;
                if (iVar20 + -6 != 0x1f) {
                  do {
                    uVar4 = puVar18[(int)uVar13];
                    *(ulong *)pcVar31 = uVar4;
                    *(ulong *)(pcVar31 + (long)(int)uVar13 * 8) = uVar4;
                    uVar27 = uVar27 - 1;
                    puVar18 = puVar18 + 1;
                    pcVar31 = pcVar31 + 8;
                  } while (uVar27 != 0);
                }
                puVar25 = puVar25 + lVar14;
                pcVar24 = pcVar24 + lVar14 * 8;
              } while (puVar25 < local_f28 + (int)uVar16);
            }
            bVar36 = true;
            bVar34 = true;
            if (0 < (int)uVar16) {
              uVar33 = 0;
              do {
                if (local_d28.pVarDefs[uVar33 - 5] !=
                    *(char (*) [8])(local_d28.Cache[0x16] + uVar33 * 8 + 0x18)) {
                  bVar34 = false;
                  goto LAB_0049ca59;
                }
                uVar33 = uVar33 + 1;
              } while (uVar16 != uVar33);
              lVar14 = 0;
              do {
                bVar34 = *(long *)(local_d28.Cache[6] + lVar14 * 8 + 0x18) ==
                         *(long *)(local_d28.pOutput + lVar14 * 8 + 0xd8);
                if (!bVar34) break;
                bVar35 = (ulong)uVar16 - 1 != lVar14;
                lVar14 = lVar14 + 1;
              } while (bVar35);
            }
LAB_0049ca59:
            if (0 < (int)uVar16) {
              uVar33 = 0;
              do {
                if (local_d28.pVarDefs[uVar33 - 5] !=
                    *(char (*) [8])(local_d28.pOutput + uVar33 * 8 + 0xd8)) {
                  bVar36 = false;
                  goto LAB_0049caa9;
                }
                uVar33 = uVar33 + 1;
              } while (uVar16 != uVar33);
              lVar14 = 0;
              do {
                bVar36 = *(long *)(local_d28.Cache[6] + lVar14 * 8 + 0x18) ==
                         *(long *)(local_d28.Cache[0x16] + lVar14 * 8 + 0x18);
                if (!bVar36) break;
                bVar35 = (ulong)uVar16 - 1 != lVar14;
                lVar14 = lVar14 + 1;
              } while (bVar35);
            }
LAB_0049caa9:
            uVar13 = uVar6;
            if ((bool)(bVar34 | bVar36)) {
              iVar5 = pVars[iVar5];
              if (Dau_DsdTtElems_pTtElems == 0) {
                puVar7 = &Dau_DsdTtElems_TtElems;
                lVar14 = 0;
                do {
                  *(undefined8 **)((long)&Dau_DsdTtElems_pTtElems + lVar14) = puVar7;
                  lVar14 = lVar14 + 8;
                  puVar7 = puVar7 + 0x40;
                } while (lVar14 != 0x68);
                uVar33 = 0;
                do {
                  if (uVar33 < 6) {
                    lVar14 = (&Dau_DsdTtElems_pTtElems)[uVar33];
                    lVar15 = 0;
                    do {
                      *(word *)(lVar14 + lVar15 * 8) = s_Truths6[uVar33];
                      lVar15 = lVar15 + 1;
                    } while (lVar15 != 0x40);
                  }
                  else {
                    lVar14 = (&Dau_DsdTtElems_pTtElems)[uVar33];
                    lVar15 = 0;
                    do {
                      *(ulong *)(lVar14 + lVar15 * 8) =
                           -(ulong)((1 << ((char)uVar33 - 6U & 0x1f) & (uint)lVar15) != 0);
                      lVar15 = lVar15 + 1;
                    } while (lVar15 != 0x40);
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar33 != 0xc);
              }
              if (0 < (int)uVar16) {
                lVar14 = (&Dau_DsdTtElems_pTtElems)[uVar32];
                uVar33 = 0;
                do {
                  uVar27 = *(ulong *)(local_d28.Cache[0x16] + uVar33 * 8 + 0x18);
                  pTruth[uVar33] =
                       (*(ulong *)(local_d28.pOutput + uVar33 * 8 + 0xd8) ^ uVar27) &
                       *(ulong *)(lVar14 + uVar33 * 8) ^ uVar27;
                  uVar33 = uVar33 + 1;
                } while (uVar16 != uVar33);
              }
              pcVar24 = "";
              if (bVar36) {
                pcVar24 = "!";
              }
              sprintf(local_1132,"<%c%c%s%c>",(ulong)(pVars[uVar32] + 0x61),
                      (ulong)(pVars[iVar20] + 0x61),pcVar24,(ulong)(iVar5 + 0x61));
              sVar8 = strlen(local_1132);
              if (7 < sVar8) {
                __assert_fail("strlen(pStr) < 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                              ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
              }
              uVar16 = p->nVarsUsed;
              uVar33 = (ulong)uVar16;
              if (0x1f < (int)uVar16) {
                __assert_fail("p->nVarsUsed < 32",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                              ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
              }
              if (0 < (int)uVar16) {
                lVar14 = 0;
                do {
                  p->Cache[(int)uVar33][lVar14] = '\0';
                  lVar14 = lVar14 + 1;
                  uVar33 = (ulong)p->nVarsUsed;
                } while (lVar14 < (long)uVar33);
              }
              uVar16 = p->nVarsUsed;
              uVar33 = (ulong)uVar16;
              if (0 < (int)uVar16) {
                lVar14 = 0;
                pacVar11 = p->Cache;
                do {
                  (*pacVar11)[(int)uVar33] = '\0';
                  lVar14 = lVar14 + 1;
                  uVar16 = p->nVarsUsed;
                  uVar33 = (ulong)(int)uVar16;
                  pacVar11 = pacVar11 + 1;
                } while (lVar14 < (long)uVar33);
              }
              p->nVarsUsed = uVar16 + 1;
              strcpy(p->pVarDefs[(int)uVar16],local_1132);
              pVars[uVar32] = p->nVarsUsed + -1;
              iVar1 = pVars[iVar20];
              uVar16 = uVar6 - 1;
              pVars[iVar20] = pVars[(long)(int)uVar6 + -1];
              pVars[(long)(int)uVar6 + -1] = iVar1;
              Abc_TtSwapVars(pTruth,uVar6,iVar20,uVar16);
              if ((int)uVar6 < 2) {
LAB_0049cede:
                __assert_fail("v < nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                              ,0x454,"int Dau_DsdFindVarDef(int *, int, int)");
              }
              uVar33 = 0;
              while (pVars[uVar33] != iVar5) {
                uVar33 = uVar33 + 1;
                if (uVar16 == uVar33) goto LAB_0049cede;
              }
              iVar5 = pVars[uVar33];
              uVar13 = uVar6 - 2;
              pVars[uVar33] = pVars[(long)(int)uVar6 + -2];
              pVars[(long)(int)uVar6 + -2] = iVar5;
              Abc_TtSwapVars(pTruth,uVar16,(int)uVar33,uVar13);
              if (uVar6 == 2) goto LAB_0049cede;
              uVar33 = 0;
              while (pVars[uVar33] != p->nVarsUsed + -1) {
                uVar33 = uVar33 + 1;
                if (uVar13 == uVar33) goto LAB_0049cede;
              }
              iVar5 = Dau_DsdDecomposeSingleVarOne(p,pTruth,pVars,uVar13,(int)uVar33);
              if (iVar5 != 0) {
                uVar13 = Dau_DsdDecomposeSingleVar(p,pTruth,pVars,uVar6 - 3);
              }
            }
            if (uVar13 == uVar6) {
              iVar5 = 6;
LAB_0049cd6e:
              bVar36 = false;
            }
            else {
              if (uVar13 == 0) {
                iVar5 = clock_gettime(3,(timespec *)&local_d28);
                if (iVar5 < 0) {
                  lVar14 = -1;
                }
                else {
                  lVar14 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 +
                           local_d28._0_8_ * 1000000;
                }
                s_Times_2 = s_Times_2 + lVar14 + local_1170;
              }
              else {
                uVar6 = Dau_DsdDecomposeDoubleVars(p,pTruth,pVars,uVar13);
                if (uVar6 != 0) {
                  uVar19 = (ulong)uVar6;
                  iVar5 = 4;
                  goto LAB_0049cd6e;
                }
                iVar5 = clock_gettime(3,(timespec *)&local_d28);
                if (iVar5 < 0) {
                  lVar14 = -1;
                }
                else {
                  lVar14 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 +
                           local_d28._0_8_ * 1000000;
                }
                s_Times_2 = s_Times_2 + lVar14 + local_1170;
                uVar19 = 0;
              }
              bVar36 = false;
              iVar5 = 1;
              local_1184 = 0;
            }
          }
        }
        if ((iVar5 != 0) && (iVar5 != 6)) {
          if (iVar5 == 4) goto LAB_0049ce5a;
          goto LAB_0049cec0;
        }
        bVar36 = 1 < (long)uVar12;
        uVar12 = uVar32;
      } while (bVar36);
      uVar12 = 0;
    }
LAB_0049ce5a:
    bVar36 = true;
    if ((int)uVar12 == 0) {
      iVar5 = clock_gettime(3,(timespec *)&local_d28);
      if (iVar5 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 + local_d28._0_8_ * 1000000;
      }
      s_Times_2 = s_Times_2 + lVar14 + local_1170;
      bVar36 = false;
      local_1184 = (int)uVar19;
    }
LAB_0049cec0:
    uVar12 = uVar19;
    if (!bVar36) {
      return local_1184;
    }
  } while( true );
}

Assistant:

int Dau_DsdDecomposeTripleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v;
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
        for ( v = nVars - 1; v >= 0; v-- )
        {
            unsigned uSupports = Dau_DsdFindSupports( p, pTruth, pVars, nVars, v );
//            Dau_DsdPrintSupports( uSupports, nVars );
            if ( (uSupports & (uSupports >> 1) & 0x55555555) == 0 ) // non-overlapping supports
                return Dau_DsdDecomposeTripleVarsOuter( p, pTruth, pVars, nVars, v );
            if ( Abc_TtSuppOnlyOne( uSupports & (~uSupports >> 1) & 0x55555555) &&
                 Abc_TtSuppOnlyOne(~uSupports & ( uSupports >> 1) & 0x55555555) ) // one unique variable in each cofactor
            {
                int nVarsNew = Dau_DsdDecomposeTripleVarsInner( p, pTruth, pVars, nVars, v, uSupports );
                if ( nVarsNew == nVars )
                    continue;
                if ( nVarsNew == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                nVars = Dau_DsdDecomposeDoubleVars( p, pTruth, pVars, nVarsNew );
                if ( nVars == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                break;
            }
        }
        if ( v == -1 )
        {
            s_Times[2] += Abc_Clock() - clk;
            return nVars;
        }
    }
    assert( 0 );
    return -1;
}